

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilBitMatrix.c
# Opt level: O1

int Extra_BitMatrixIsClique(Extra_BitMat_t *pMat)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int i;
  int iVar4;
  int k;
  
  if (0 < pMat->nSize) {
    i = 0;
    do {
      iVar4 = i + 1;
      k = iVar4;
      if (iVar4 < pMat->nSize) {
        do {
          iVar1 = Extra_BitMatrixLookup1(pMat,i,k);
          if ((iVar1 != 0) && (0 < pMat->nSize)) {
            iVar1 = 0;
            do {
              if (k != iVar1 && i != iVar1) {
                iVar2 = Extra_BitMatrixLookup1(pMat,iVar1,i);
                iVar3 = Extra_BitMatrixLookup1(pMat,iVar1,k);
                if (iVar2 != iVar3) {
                  return 0;
                }
              }
              iVar1 = iVar1 + 1;
            } while (iVar1 < pMat->nSize);
          }
          k = k + 1;
        } while (k < pMat->nSize);
      }
      i = iVar4;
    } while (iVar4 < pMat->nSize);
  }
  return 1;
}

Assistant:

int Extra_BitMatrixIsClique( Extra_BitMat_t * pMat )
{
    int v, u, i;
    for ( v = 0; v < pMat->nSize; v++ )
    for ( u = v+1; u < pMat->nSize; u++ )
    {
        if ( !Extra_BitMatrixLookup1( pMat, v, u ) )
            continue;
        // v and u are symmetric
        for ( i = 0; i < pMat->nSize; i++ )
        {
            if ( i == v || i == u )
                continue;
            // i is neither v nor u
            // the symmetry status of i is the same w.r.t. to v and u
            if ( Extra_BitMatrixLookup1( pMat, i, v ) != Extra_BitMatrixLookup1( pMat, i, u ) )
                return 0;
        }
    }
    return 1;
}